

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

string * __thiscall
chaiscript::detail::Dispatch_Engine::get_type_name_abi_cxx11_
          (string *__return_storage_ptr__,Dispatch_Engine *this,Type_Info *ti)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  char *__s;
  allocator<char> local_39;
  pthread_rwlock_t *local_38;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  p_Var3 = (this->m_state).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_state).m_types._M_t._M_impl.super__Rb_tree_header;
  local_38 = (pthread_rwlock_t *)this;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      bVar2 = Type_Info::bare_equal((Type_Info *)(p_Var3 + 2),ti);
      if (bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        if (bVar2) goto LAB_0031a208;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  if ((ti->m_flags & 0x20) == 0) {
    __s = *(char **)(ti->m_bare_type_info + 8) + (**(char **)(ti->m_bare_type_info + 8) == '*');
  }
  else {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_39)
  ;
LAB_0031a208:
  pthread_rwlock_unlock(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string get_type_name(const Type_Info &ti) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        for (const auto &elem : m_state.m_types) {
          if (elem.second.bare_equal(ti)) {
            return elem.first;
          }
        }

        return ti.bare_name();
      }